

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::save_scene_object(level_tools *this,xr_object *object,char *name)

{
  uint32_t uVar1;
  xr_visual_object *this_00;
  string *psVar2;
  undefined8 uVar3;
  xr_file_system *this_01;
  uint32_t *puVar4;
  xr_visual_object *local_60;
  xr_visual_object *local_58;
  xr_visual_object *new_visual;
  undefined1 local_40 [8];
  string reference;
  char *name_local;
  xr_object *object_local;
  level_tools *this_local;
  
  reference.field_2._8_8_ = name;
  if (this->m_rmode != 1) {
    std::__cxx11::string::string((string *)local_40);
    make_object_ref(this,(string *)local_40,(char *)reference.field_2._8_8_);
    this_00 = (xr_visual_object *)operator_new(0x98);
    xray_re::xr_visual_object::xr_visual_object(this_00,this->m_scene);
    local_58 = this_00;
    psVar2 = xray_re::xr_custom_object::co_name_abi_cxx11_((xr_custom_object *)this_00);
    std::__cxx11::string::operator=((string *)psVar2,(string *)local_40);
    psVar2 = xray_re::xr_visual_object::reference_abi_cxx11_(local_58);
    std::__cxx11::string::operator=((string *)psVar2,(string *)local_40);
    local_60 = local_58;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
    push_back(this->m_scene_visuals,(value_type *)&local_60);
    uVar3 = std::__cxx11::string::append(local_40);
    (*(object->super_xr_surface_factory)._vptr_xr_surface_factory[10])(object,"$objects$",uVar3,0);
    this_01 = xray_re::xr_file_system::instance();
    uVar1 = xray_re::xr_file_system::file_age(this_01,"$objects$",(string *)local_40);
    puVar4 = xray_re::xr_visual_object::file_version(local_58);
    *puVar4 = uVar1;
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("m_rmode != RM_MAYA",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                ,0x1e,"void level_tools::save_scene_object(const xr_object *, const char *)");
}

Assistant:

void level_tools::save_scene_object(const xr_object* object, const char* name)
{
	xr_assert(m_rmode != RM_MAYA);

	std::string reference;
	make_object_ref(reference, name);
	xr_visual_object* new_visual = new xr_visual_object(*m_scene);
	new_visual->co_name() = reference;
	new_visual->reference() = reference;
	m_scene_visuals->push_back(new_visual);
	object->save_object(PA_OBJECTS, reference.append(".object"));
	new_visual->file_version() = xr_file_system::instance().file_age(PA_OBJECTS, reference);
}